

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_parse_sign(string *text,bool *negative_ptr)

{
  string *psVar1;
  char *pcVar2;
  long lVar3;
  byte *in_RSI;
  string *in_RDI;
  bool bVar4;
  char *end;
  char *start;
  string local_48 [32];
  char *local_28;
  char *local_20;
  byte *local_18;
  string *local_10;
  bool local_1;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  pcVar2 = (char *)std::__cxx11::string::data();
  local_20 = pcVar2;
  lVar3 = std::__cxx11::string::size();
  psVar1 = local_10;
  local_28 = pcVar2 + lVar3;
  while( true ) {
    bVar4 = false;
    if (local_20 < local_28) {
      bVar4 = *local_20 == ' ';
    }
    if (!bVar4) break;
    local_20 = local_20 + 1;
  }
  while( true ) {
    bVar4 = false;
    if (local_20 < local_28) {
      bVar4 = local_28[-1] == ' ';
    }
    if (!bVar4) break;
    local_28 = local_28 + -1;
  }
  if (local_20 < local_28) {
    *local_18 = *local_20 == '-';
    if ((((*local_18 & 1) == 0) && (*local_20 != '+')) ||
       (local_20 = local_20 + 1, local_20 < local_28)) {
      std::__cxx11::string::data();
      std::__cxx11::string::substr((ulong)local_48,(ulong)psVar1);
      std::__cxx11::string::operator=(local_10,local_48);
      std::__cxx11::string::~string(local_48);
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

inline bool safe_parse_sign(std::string *text /*inout*/,
                            bool *negative_ptr /*output*/) {
  const char* start = text->data();
  const char* end = start + text->size();

  // Consume whitespace.
  while (start < end && (start[0] == ' ')) {
    ++start;
  }
  while (start < end && (end[-1] == ' ')) {
    --end;
  }
  if (start >= end) {
    return false;
  }

  // Consume sign.
  *negative_ptr = (start[0] == '-');
  if (*negative_ptr || start[0] == '+') {
    ++start;
    if (start >= end) {
      return false;
    }
  }
  *text = text->substr(start - text->data(), end - start);
  return true;
}